

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_map.hpp
# Opt level: O2

ostream * operator<<(ostream *out,
                    skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
                    *sl)

{
  pointer pbVar1;
  pointer ppSVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  pointer pbVar5;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar6;
  int i;
  int iVar7;
  int iVar8;
  int iVar9;
  int local_a4;
  pointer local_a0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  
  if ((sl->key).
      super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (sl->key).
      super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(out,"Values: ");
    local_88._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88._M_impl.super__Rb_tree_header._M_header;
    local_88._M_impl._0_8_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    pSVar6 = *(sl->key).
              super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a4 = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pSVar6 = pSVar6->next,
          pSVar6 != (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
      pbVar1 = *(pointer *)
                ((long)&(pSVar6->valz).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 8);
      for (pbVar5 = *(pointer *)
                     &(pSVar6->valz).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
        std::__cxx11::string::string((string *)&value,(string *)pbVar5);
        poVar3 = std::operator<<(out,(string *)&value);
        std::operator<<(poVar3,", ");
        std::__cxx11::string::~string((string *)&value);
      }
      pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_88,&pSVar6->val);
      *pmVar4 = local_a4;
      local_a4 = local_a4 + 1;
    }
    std::endl<char,std::char_traits<char>>(out);
    ppSVar2 = (sl->key).
              super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (sl->key).
               super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    while (local_a0 != ppSVar2) {
      std::operator<<(out,"S");
      pSVar6 = local_a0[-1];
      local_a0 = local_a0 + -1;
      iVar7 = -1;
      while( true ) {
        pSVar6 = pSVar6->next;
        if (pSVar6 == (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0) break;
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_88,&pSVar6->val);
        iVar9 = *pmVar4;
        for (iVar8 = 1; iVar8 < iVar9 - iVar7; iVar8 = iVar8 + 1) {
          std::operator<<(out,"----");
        }
        poVar3 = std::operator<<(out,"-");
        poVar3 = std::operator<<(poVar3,0x2d);
        *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
        std::ostream::operator<<((ostream *)poVar3,pSVar6->val);
        iVar7 = iVar9;
      }
      for (iVar9 = 1; iVar9 < local_a4 - iVar7; iVar9 = iVar9 + 1) {
        std::operator<<(out,"----");
      }
      std::operator<<(out,"-E");
      std::endl<char,std::char_traits<char>>(out);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_88);
    return out;
  }
  poVar3 = std::operator<<(out,"EMPTY SKIPLIST");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  return poVar3;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const skiplist<T, V, X>& sl) {
    if (sl.key.empty()) {
        return out << "EMPTY SKIPLIST" << std::endl;
    }

    out << "Values: ";
    // store mapping of node->index in a map
    std::map<T, int> index_store{};
    auto bottom_it = (*(sl.key.begin()))->next;
    int cur_index = 0;
    while (bottom_it) {
        for (auto value : bottom_it->valz) {
          out << value << ", ";
        }

        index_store[bottom_it->val] = cur_index;
        cur_index++;
        bottom_it = bottom_it->next;
    }
    out << std::endl;

    auto level = sl.key.rbegin();
    auto end = sl.key.rend();
    while(level != end) {
        // S denotes start of level, could be something different
        out << "S";

        // to store previous element's index
        // and current element's index
        int index = -1, next_index;
        // skip the first element - it is always 0
        auto it = (*level)->next;
        // iterate through the list at this level
        while (it) {
            next_index = index_store[it->val];

            // filler to align it correctly
            // when elements in between don't exist at this level
            for (int i = 1; i < next_index - index; ++i) {
                out << "----";
            }

            // width of printed element is hardcoded to 3 for now
            // the padding is filled with ""-"
            out << "-" << std::setfill('-') << std::setw(3) << it->val;
            it = it->next;

            index = next_index;
        }
        next_index = cur_index;

        for (int i = 1; i < next_index - index; ++i) {
            out << "----";
        }

        out << "-E";

        out << std::endl;

        level++;
    }

    return out;
}